

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void glob_dsp(void *dummy,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 in_register_00000014;
  t_float tVar2;
  
  if (argc == 0) {
    post("dsp state %d",(ulong)(uint)(pd_maininstance.pd_gui)->i_dspstate,
         CONCAT44(in_register_00000014,argc),in_RAX);
    return;
  }
  tVar2 = atom_getfloatarg(0,argc,argv);
  if ((int)tVar2 == 0) {
    if ((pd_maininstance.pd_gui)->i_dspstate != 0) {
      canvas_stop_dsp();
      iVar1 = audio_shouldkeepopen();
      if (iVar1 == 0) {
        sys_set_audio_state(0);
        return;
      }
    }
  }
  else if ((pd_maininstance.pd_gui)->i_dspstate == 0) {
    sys_set_audio_state(1);
    canvas_start_dsp();
    return;
  }
  return;
}

Assistant:

void glob_dsp(void *dummy, t_symbol *s, int argc, t_atom *argv)
{
    int newstate;
    if (argc)
    {
        newstate = atom_getfloatarg(0, argc, argv);
        if (newstate && !THISGUI->i_dspstate)
        {
            sys_set_audio_state(1);
            canvas_start_dsp();
        }
        else if (!newstate && THISGUI->i_dspstate)
        {
            canvas_stop_dsp();
            if (!audio_shouldkeepopen())
                sys_set_audio_state(0);
        }
    }
    else post("dsp state %d", THISGUI->i_dspstate);
}